

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl_Still::commitExposure(Private_Impl_Still *this)

{
  char *__s;
  MMAL_STATUS_T MVar1;
  size_t sVar2;
  MMAL_PARAMETER_EXPOSUREMODE_T exp_mode;
  MMAL_PARAMETER_HEADER_T local_1c;
  MMAL_PARAM_EXPOSUREMODE_T local_14;
  
  local_1c.id = 0x10012;
  local_1c.size = 0xc;
  local_14 = convertExposure(this,this->exposure);
  MVar1 = mmal_port_parameter_set(this->camera->control,&local_1c);
  if (MVar1 != MMAL_SUCCESS) {
    __s = this->API_NAME;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set exposure parameter.\n",0x24);
  }
  return;
}

Assistant:

void Private_Impl_Still::commitExposure() {
            MMAL_PARAMETER_EXPOSUREMODE_T exp_mode = {{MMAL_PARAMETER_EXPOSURE_MODE,sizeof ( exp_mode ) }, convertExposure ( exposure ) };
            if ( mmal_port_parameter_set ( camera->control, &exp_mode.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set exposure parameter.\n";
        }